

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GB.cpp
# Opt level: O0

void __thiscall OpenMD::GB::calcForce(GB *this,InteractionData *idat)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  reference pvVar5;
  reference this_00;
  reference pvVar6;
  double *pdVar7;
  int *in_RSI;
  long in_RDI;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  Vector<double,_3U> *pVVar13;
  Vector3d uxu;
  Vector3d rxu2;
  Vector3d rxu1;
  Vector3d rhat;
  RealType dUdg;
  RealType dUdb;
  RealType dUda;
  RealType dUdr;
  RealType pref2;
  RealType pref1;
  RealType s03;
  RealType s3;
  RealType U;
  RealType R13;
  RealType R12;
  RealType R7;
  RealType R6;
  RealType R3;
  RealType BigR;
  RealType eps;
  RealType e2;
  RealType e1;
  RealType sigma;
  RealType Hp;
  RealType H;
  RealType g2;
  RealType bu2;
  RealType au2;
  RealType bu;
  RealType au;
  RealType g;
  RealType b;
  RealType a;
  Vector3d ul2;
  Vector3d ul1;
  RealType xpapi2;
  RealType xpap2;
  RealType xp2;
  RealType xai2;
  RealType xa2;
  RealType x2;
  RealType eps0;
  RealType dw;
  RealType sigma0;
  GBInteractionData *mixer;
  Vector<double,_3U> *in_stack_fffffffffffffc38;
  Vector<double,_3U> *in_stack_fffffffffffffc40;
  Vector<double,_3U> *in_stack_fffffffffffffc48;
  Vector<double,_3U> *in_stack_fffffffffffffc50;
  double dVar14;
  RectMatrix<double,_3U,_3U> *in_stack_fffffffffffffc58;
  RealType RVar15;
  GB *in_stack_fffffffffffffc80;
  Vector3<double> *in_stack_fffffffffffffca0;
  Vector3<double> *in_stack_fffffffffffffca8;
  double local_d8;
  double local_d0;
  double local_c8;
  
  if ((*(byte *)(in_RDI + 8) & 1) == 0) {
    initialize(in_stack_fffffffffffffc80);
  }
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x60),(long)*in_RSI);
  this_00 = std::
            vector<std::vector<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>,_std::allocator<std::vector<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>_>_>
            ::operator[]((vector<std::vector<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>,_std::allocator<std::vector<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>_>_>
                          *)(in_RDI + 0x78),(long)*pvVar5);
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x60),(long)in_RSI[1]);
  pvVar6 = std::vector<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>::
           operator[](this_00,(long)*pvVar5);
  dVar12 = pvVar6->sigma0;
  dVar1 = pvVar6->dw;
  RVar15 = pvVar6->eps0;
  dVar10 = pvVar6->x2;
  dVar9 = pvVar6->xa2;
  dVar11 = pvVar6->xai2;
  dVar2 = pvVar6->xp2;
  dVar3 = pvVar6->xpap2;
  dVar4 = pvVar6->xpapi2;
  RectMatrix<double,_3U,_3U>::getRow
            (in_stack_fffffffffffffc58,(uint)((ulong)in_stack_fffffffffffffc50 >> 0x20));
  Vector3<double>::Vector3((Vector3<double> *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
  RectMatrix<double,_3U,_3U>::getRow
            (in_stack_fffffffffffffc58,(uint)((ulong)in_stack_fffffffffffffc50 >> 0x20));
  Vector3<double>::Vector3((Vector3<double> *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
  if ((pvVar6->i_is_LJ & 1U) == 0) {
    local_c8 = dot<double,3u>(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
  }
  else {
    local_c8 = 0.0;
    Vector3<double>::operator=
              ((Vector3<double> *)in_stack_fffffffffffffc40,
               (Vector3<double> *)in_stack_fffffffffffffc38);
  }
  if ((pvVar6->j_is_LJ & 1U) == 0) {
    local_d0 = dot<double,3u>(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
  }
  else {
    local_d0 = 0.0;
    Vector3<double>::operator=
              ((Vector3<double> *)in_stack_fffffffffffffc40,
               (Vector3<double> *)in_stack_fffffffffffffc38);
  }
  if (((pvVar6->i_is_LJ & 1U) == 0) && ((pvVar6->j_is_LJ & 1U) == 0)) {
    local_d8 = dot<double,3u>(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
  }
  else {
    local_d8 = 0.0;
  }
  local_c8 = local_c8 / *(double *)(in_RSI + 8);
  local_d0 = local_d0 / *(double *)(in_RSI + 8);
  dVar8 = local_d8 * local_d8;
  dVar14 = dVar12;
  dVar9 = sqrt(1.0 - (-(dVar10 * 2.0 * local_c8 * local_d0) * local_d8 +
                     dVar9 * local_c8 * local_c8 + dVar11 * local_d0 * local_d0) /
                     (-dVar10 * dVar8 + 1.0));
  dVar10 = sqrt(-dVar10 * dVar8 + 1.0);
  dVar10 = pow(1.0 / dVar10,*(double *)(in_RDI + 0xd8));
  dVar11 = pow(1.0 - (-(dVar2 * 2.0 * local_c8 * local_d0) * local_d8 +
                     dVar3 * local_c8 * local_c8 + dVar4 * local_d0 * local_d0) /
                     (-dVar2 * dVar8 + 1.0),*(double *)(in_RDI + 0xd0));
  dVar12 = (dVar1 * dVar12) / (dVar1 * dVar12 + (*(double *)(in_RSI + 8) - dVar14 / dVar9));
  dVar12 = dVar12 * dVar12 * dVar12;
  dVar12 = dVar12 * dVar12;
  pVVar13 = (Vector<double,_3U> *)
            (*(double *)(in_RSI + 0x14) * 4.0 * RVar15 * dVar10 * dVar11 *
            (dVar12 * dVar12 - dVar12));
  operator/(in_stack_fffffffffffffc48,(double)in_stack_fffffffffffffc40);
  Vector3<double>::Vector3((Vector3<double> *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
  cross<double>(in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
  cross<double>(in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
  cross<double>(in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
  dVar12 = *(double *)(in_RSI + 0x10);
  pdVar7 = Vector<double,_7U>::operator[]((Vector<double,_7U> *)(in_RSI + 0x18),1);
  *pdVar7 = (double)pVVar13 * dVar12 + *pdVar7;
  if ((*(byte *)((long)in_RSI + 0xdb) & 1) != 0) {
    in_stack_fffffffffffffc48 = *(Vector<double,_3U> **)(in_RSI + 0x10);
    in_stack_fffffffffffffc40 = pVVar13;
    pdVar7 = Vector<double,_7U>::operator[]((Vector<double,_7U> *)(in_RSI + 0x38),1);
    *pdVar7 = (double)in_stack_fffffffffffffc40 * (double)in_stack_fffffffffffffc48 + *pdVar7;
  }
  OpenMD::operator*((double)in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
  OpenMD::operator*((double)in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
  OpenMD::operator+(in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
  OpenMD::operator*((double)in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
  OpenMD::operator+(in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
  OpenMD::operator*(in_stack_fffffffffffffc48,(double)in_stack_fffffffffffffc40);
  Vector<double,_3U>::operator+=(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
  OpenMD::operator*((double)in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
  OpenMD::operator*((double)in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
  OpenMD::operator-(in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
  OpenMD::operator*(in_stack_fffffffffffffc48,(double)in_stack_fffffffffffffc40);
  Vector<double,_3U>::operator+=(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
  OpenMD::operator*((double)in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
  OpenMD::operator*((double)in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
  OpenMD::operator+(in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
  OpenMD::operator*(in_stack_fffffffffffffc48,(double)in_stack_fffffffffffffc40);
  Vector<double,_3U>::operator+=(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
  *(double *)(in_RSI + 0x34) = (double)pVVar13 + *(double *)(in_RSI + 0x34);
  return;
}

Assistant:

void GB::calcForce(InteractionData& idat) {
    if (!initialized_) initialize();

    GBInteractionData& mixer =
        MixingMap[GBtids[idat.atid1]][GBtids[idat.atid2]];

    RealType sigma0 = mixer.sigma0;
    RealType dw     = mixer.dw;
    RealType eps0   = mixer.eps0;
    RealType x2     = mixer.x2;
    RealType xa2    = mixer.xa2;
    RealType xai2   = mixer.xai2;
    RealType xp2    = mixer.xp2;
    RealType xpap2  = mixer.xpap2;
    RealType xpapi2 = mixer.xpapi2;

    Vector3d ul1 = idat.A1.getRow(2);
    Vector3d ul2 = idat.A2.getRow(2);

    RealType a, b, g;

    if (mixer.i_is_LJ) {
      a   = 0.0;
      ul1 = V3Zero;
    } else {
      a = dot(idat.d, ul1);
    }

    if (mixer.j_is_LJ) {
      b   = 0.0;
      ul2 = V3Zero;
    } else {
      b = dot(idat.d, ul2);
    }

    if (mixer.i_is_LJ || mixer.j_is_LJ)
      g = 0.0;
    else
      g = dot(ul1, ul2);

    RealType au = a / idat.rij;
    RealType bu = b / idat.rij;

    RealType au2 = au * au;
    RealType bu2 = bu * bu;
    RealType g2  = g * g;

    RealType H =
        (xa2 * au2 + xai2 * bu2 - 2.0 * x2 * au * bu * g) / (1.0 - x2 * g2);
    RealType Hp = (xpap2 * au2 + xpapi2 * bu2 - 2.0 * xp2 * au * bu * g) /
                  (1.0 - xp2 * g2);

    RealType sigma = sigma0 / sqrt(1.0 - H);
    RealType e1    = 1.0 / sqrt(1.0 - x2 * g2);
    RealType e2    = 1.0 - Hp;
    RealType eps   = eps0 * pow(e1, nu_) * pow(e2, mu_);
    RealType BigR  = dw * sigma0 / (idat.rij - sigma + dw * sigma0);

    RealType R3  = BigR * BigR * BigR;
    RealType R6  = R3 * R3;
    RealType R7  = R6 * BigR;
    RealType R12 = R6 * R6;
    RealType R13 = R6 * R7;

    RealType U = idat.vdwMult * 4.0 * eps * (R12 - R6);

    RealType s3  = sigma * sigma * sigma;
    RealType s03 = sigma0 * sigma0 * sigma0;

    RealType pref1 =
        -idat.vdwMult * 8.0 * eps * mu_ * (R12 - R6) / (e2 * idat.rij);

    RealType pref2 = idat.vdwMult * 8.0 * eps * s3 * (6.0 * R13 - 3.0 * R7) /
                     (dw * idat.rij * s03);

    RealType dUdr =
        -(pref1 * Hp + pref2 * (sigma0 * sigma0 * idat.rij / s3 + H));

    RealType dUda = pref1 * (xpap2 * au - xp2 * bu * g) / (1.0 - xp2 * g2) +
                    pref2 * (xa2 * au - x2 * bu * g) / (1.0 - x2 * g2);

    RealType dUdb = pref1 * (xpapi2 * bu - xp2 * au * g) / (1.0 - xp2 * g2) +
                    pref2 * (xai2 * bu - x2 * au * g) / (1.0 - x2 * g2);

    RealType dUdg = 4.0 * eps * nu_ * (R12 - R6) * x2 * g / (1.0 - x2 * g2) +
                    8.0 * eps * mu_ * (R12 - R6) *
                        (xp2 * au * bu - Hp * xp2 * g) / (1.0 - xp2 * g2) / e2 +
                    8.0 * eps * s3 * (3.0 * R7 - 6.0 * R13) *
                        (x2 * au * bu - H * x2 * g) / (1.0 - x2 * g2) /
                        (dw * s03);

    Vector3d rhat = idat.d / idat.rij;
    Vector3d rxu1 = cross(idat.d, ul1);
    Vector3d rxu2 = cross(idat.d, ul2);
    Vector3d uxu  = cross(ul1, ul2);

    idat.pot[VANDERWAALS_FAMILY] += U * idat.sw;
    if (idat.isSelected) idat.selePot[VANDERWAALS_FAMILY] += U * idat.sw;

    idat.f1 += (dUdr * rhat + dUda * ul1 + dUdb * ul2) * idat.sw;
    idat.t1 += (dUda * rxu1 - dUdg * uxu) * idat.sw;
    idat.t2 += (dUdb * rxu2 + dUdg * uxu) * idat.sw;
    idat.vpair += U;
    return;
  }